

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall
ON_Layer::GetPerViewportVisibilityViewportIds
          (ON_Layer *this,ON_SimpleArray<ON_UUID_struct> *viewport_id_list)

{
  int iVar1;
  uint uVar2;
  ON__LayerExtensions *pOVar3;
  ON__LayerPerViewSettings *this_00;
  ON__LayerPerViewSettings *s;
  int i;
  int count;
  ON__LayerExtensions *ud;
  ON_SimpleArray<ON_UUID_struct> *viewport_id_list_local;
  ON_Layer *this_local;
  
  ON_SimpleArray<ON_UUID_struct>::SetCount(viewport_id_list,0);
  pOVar3 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
  if ((pOVar3 != (ON__LayerExtensions *)0x0) &&
     (iVar1 = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOVar3->m_vp_settings), 0 < iVar1)) {
    ON_SimpleArray<ON_UUID_struct>::Reserve(viewport_id_list,(long)iVar1);
    for (s._0_4_ = 0; (int)s < iVar1; s._0_4_ = (int)s + 1) {
      this_00 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[](&pOVar3->m_vp_settings,(int)s);
      uVar2 = ON__LayerPerViewSettings::SettingsMask(this_00);
      if (((uVar2 & 0x10) != 0) ||
         (uVar2 = ON__LayerPerViewSettings::SettingsMask(this_00), (uVar2 & 0x20) != 0)) {
        ON_SimpleArray<ON_UUID_struct>::Append(viewport_id_list,&this_00->m_viewport_id);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::GetPerViewportVisibilityViewportIds(
    ON_SimpleArray<ON_UUID>& viewport_id_list
    ) const
{
  viewport_id_list.SetCount(0);
  const ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 != ud )
  {
    const int count = ud->m_vp_settings.Count();
    if ( count > 0 )
    {
      viewport_id_list.Reserve(count);
      for( int i = 0; i < count; i++ )
      {
        const ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
        if (    0 != ( ON_Layer::per_viewport_visible & s.SettingsMask() ) 
             || 0 != ( ON_Layer::per_viewport_persistent_visibility & s.SettingsMask() ) 
           )
        {
          viewport_id_list.Append(s.m_viewport_id);
        }
      }
    }
  }
}